

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::SignalEventExpressionSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,SignalEventExpressionSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  if (this == (SignalEventExpressionSyntax *)0x2) {
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[3].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
  }
  else {
    if (this != (SignalEventExpressionSyntax *)0x1) {
      if (this == (SignalEventExpressionSyntax *)0x0) {
        return (PtrTokenOrSyntax *)
               ((long)&__return_storage_ptr__[1].
                       super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                       super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                       super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
               + 8);
      }
      return (PtrTokenOrSyntax *)0x0;
    }
    pPVar1 = *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[2].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax SignalEventExpressionSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &edge;
        case 1: return expr.get();
        case 2: return iffClause;
        default: return nullptr;
    }
}